

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ulist.cpp
# Opt level: O0

UBool ulist_containsString_63(UList *list,char *data,int32_t length)

{
  int iVar1;
  size_t sVar2;
  UListNode *local_30;
  UListNode *pointer;
  int32_t length_local;
  char *data_local;
  UList *list_local;
  
  if (list != (UList *)0x0) {
    for (local_30 = list->head; local_30 != (UListNode *)0x0; local_30 = local_30->next) {
      sVar2 = strlen((char *)local_30->data);
      if ((length == (int)sVar2) && (iVar1 = memcmp(data,local_30->data,(long)length), iVar1 == 0))
      {
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2 ulist_containsString(const UList *list, const char *data, int32_t length) {
    if (list != NULL) {
        const UListNode *pointer;
        for (pointer = list->head; pointer != NULL; pointer = pointer->next) {
            if (length == (int32_t)uprv_strlen((const char *)pointer->data)) {
                if (uprv_memcmp(data, pointer->data, length) == 0) {
                    return TRUE;
                }
            }
        }
    }
    return FALSE;
}